

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestMemCheckHandler::ProcessMemCheckBoundsCheckerOutput
          (cmCTestMemCheckHandler *this,string *str,string *log,
          vector<int,_std::allocator<int>_> *results)

{
  cmCTest *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  size_type sVar7;
  void *this_00;
  char *pcVar8;
  reference pvVar9;
  long lVar10;
  size_type length;
  reference piVar11;
  reference pvVar12;
  string local_5d8 [32];
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_5b8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_5b0;
  cmDuration local_5a8;
  undefined1 local_5a0 [8];
  ostringstream cmCTestLog_msg_2;
  iterator iStack_420;
  int err;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  string local_400 [4];
  int defects;
  undefined1 local_3e0 [8];
  ostringstream cmCTestLog_msg_1;
  string *theLine;
  cmBoundsCheckerParser parser;
  size_type cc;
  undefined1 local_1d0 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  time_point sttime;
  vector<int,_std::allocator<int>_> *results_local;
  string *log_local;
  string *str_local;
  cmCTestMemCheckHandler *this_local;
  
  std::__cxx11::string::clear();
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::chrono::_V2::steady_clock::now();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48);
  cmsys::SystemTools::Split
            (str,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
  poVar6 = std::operator<<((ostream *)local_1d0,"Start test: ");
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
  this_00 = (void *)std::ostream::operator<<(poVar6,sVar7);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::ostringstream::str();
  pcVar8 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x448,pcVar8,
               (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet & 1));
  std::__cxx11::string::~string((string *)&cc);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
  for (parser.Log.field_2._8_8_ = 0; uVar2 = parser.Log.field_2._8_8_,
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_48), (ulong)uVar2 < sVar7;
      parser.Log.field_2._8_8_ = parser.Log.field_2._8_8_ + 1) {
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_48,parser.Log.field_2._8_8_);
    bVar3 = std::operator==(pvVar9,"******######*****Begin BOUNDS CHECKER XML******######******");
    if (bVar3) break;
  }
  cmBoundsCheckerParser::cmBoundsCheckerParser
            ((cmBoundsCheckerParser *)&theLine,
             (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
  cmXMLParser::InitializeParser((cmXMLParser *)&theLine);
  uVar2 = parser.Log.field_2._8_8_;
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
  if ((ulong)uVar2 < sVar7) {
    while( true ) {
      parser.Log.field_2._8_8_ = parser.Log.field_2._8_8_ + 1;
      uVar2 = parser.Log.field_2._8_8_;
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_48);
      if (sVar7 <= (ulong)uVar2) break;
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_48,parser.Log.field_2._8_8_);
      lVar10 = std::__cxx11::string::find((char *)pvVar9,0xd17c38);
      if (lVar10 == -1) {
        pcVar8 = (char *)std::__cxx11::string::c_str();
        length = std::__cxx11::string::size();
        iVar4 = cmXMLParser::ParseChunk((cmXMLParser *)&theLine,pcVar8,length);
        if (iVar4 == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
          poVar6 = std::operator<<((ostream *)local_3e0,"Error in ParseChunk: ");
          poVar6 = std::operator<<(poVar6,(string *)pvVar9);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                       ,0x45a,pcVar8,false);
          std::__cxx11::string::~string(local_400);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e0);
        }
      }
    }
  }
  __range1._4_4_ = 0;
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)&parser.CTest);
  iStack_420 = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)&parser.CTest);
  while (bVar3 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffbe0), bVar3) {
    piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator*(&__end1);
    pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](results,(long)*piVar11);
    *pvVar12 = *pvVar12 + 1;
    __range1._4_4_ = __range1._4_4_ + 1;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a0);
  poVar6 = std::operator<<((ostream *)local_5a0,"End test (elapsed: ");
  local_5b8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_5b0.__r =
       (rep)std::chrono::operator-
                      (&local_5b8,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&lines.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_5a8,&local_5b0);
  uVar5 = cmDurationTo<unsigned_int>(&local_5a8);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar5);
  poVar6 = std::operator<<(poVar6,"s)");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::ostringstream::str();
  pcVar8 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x468,pcVar8,
               (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet & 1));
  std::__cxx11::string::~string(local_5d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a0);
  if (__range1._4_4_ != 0) {
    std::__cxx11::string::operator=
              ((string *)log,
               (string *)
               &parser.Errors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  this->DefectCount = __range1._4_4_ + this->DefectCount;
  cmBoundsCheckerParser::~cmBoundsCheckerParser((cmBoundsCheckerParser *)&theLine);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  return __range1._4_4_ == 0;
}

Assistant:

bool cmCTestMemCheckHandler::ProcessMemCheckBoundsCheckerOutput(
  const std::string& str, std::string& log, std::vector<int>& results)
{
  log.clear();
  auto sttime = std::chrono::steady_clock::now();
  std::vector<std::string> lines;
  cmsys::SystemTools::Split(str, lines);
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "Start test: " << lines.size() << std::endl, this->Quiet);
  std::vector<std::string>::size_type cc;
  for (cc = 0; cc < lines.size(); cc++) {
    if (lines[cc] == BOUNDS_CHECKER_MARKER) {
      break;
    }
  }
  cmBoundsCheckerParser parser(this->CTest);
  parser.InitializeParser();
  if (cc < lines.size()) {
    for (cc++; cc < lines.size(); ++cc) {
      std::string& theLine = lines[cc];
      // check for command line arguments that are not escaped
      // correctly by BC
      if (theLine.find("TargetArgs=") != std::string::npos) {
        // skip this because BC gets it wrong and we can't parse it
      } else if (!parser.ParseChunk(theLine.c_str(), theLine.size())) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Error in ParseChunk: " << theLine << std::endl);
      }
    }
  }
  int defects = 0;
  for (int err : parser.Errors) {
    results[err]++;
    defects++;
  }
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "End test (elapsed: "
                       << cmDurationTo<unsigned int>(
                            std::chrono::steady_clock::now() - sttime)
                       << "s)" << std::endl,
                     this->Quiet);
  if (defects) {
    // only put the output of Bounds Checker if there were
    // errors or leaks detected
    log = parser.Log;
  }
  this->DefectCount += defects;
  return defects == 0;
}